

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unary.cpp
# Opt level: O1

void __thiscall DragonParser::InterNamespace::Unary::Unary(Unary *this,Token *tkn,Expr *x)

{
  Type *t;
  
  t = SymbolNamespace::Type::max(SymbolNamespace::Type::Int,&x->type);
  Op::Op(&this->super_Op,tkn,t);
  (this->super_Op).super_Expr._vptr_Expr = (_func_int **)&PTR_gen_0010ad70;
  Expr::Expr(&this->expr);
  (this->expr).super_Node.lex_line = (x->super_Node).lex_line;
  (this->expr).op.tag = (x->op).tag;
  SymbolNamespace::Type::operator=(&(this->expr).type,&x->type);
  return;
}

Assistant:

Unary::Unary(Token &tkn, Expr &x) :
            Op(tkn,
               const_cast<Type&>(*Type::max(const_cast<Type&>(*(Type::Int)), x.type))) {
        expr = x;
    }